

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<NULLCRef,_false,_false>::grow_and_add
          (FastVector<NULLCRef,_false,_false> *this,uint newSize,NULLCRef *val)

{
  uint uVar1;
  NULLCRef *pNVar2;
  NULLCRef *pNVar3;
  
  pNVar2 = this->data;
  grow_no_destroy(this,newSize);
  pNVar3 = this->data;
  uVar1 = this->count;
  this->count = uVar1 + 1;
  *(undefined4 *)((long)&pNVar3[uVar1].ptr + 4) = *(undefined4 *)((long)&val->ptr + 4);
  *(undefined8 *)(pNVar3 + uVar1) = *(undefined8 *)val;
  if (pNVar2 != (NULLCRef *)0x0) {
    (*(code *)NULLC::dealloc)(pNVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}